

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIO.cpp
# Opt level: O1

array<char,_32UL> *
highsDoubleToString(array<char,_32UL> *__return_storage_ptr__,double val,double tolerance)

{
  int iVar1;
  char *__format;
  double dVar2;
  
  __return_storage_ptr__->_M_elems[0x10] = '\0';
  __return_storage_ptr__->_M_elems[0x11] = '\0';
  __return_storage_ptr__->_M_elems[0x12] = '\0';
  __return_storage_ptr__->_M_elems[0x13] = '\0';
  __return_storage_ptr__->_M_elems[0x14] = '\0';
  __return_storage_ptr__->_M_elems[0x15] = '\0';
  __return_storage_ptr__->_M_elems[0x16] = '\0';
  __return_storage_ptr__->_M_elems[0x17] = '\0';
  __return_storage_ptr__->_M_elems[0x18] = '\0';
  __return_storage_ptr__->_M_elems[0x19] = '\0';
  __return_storage_ptr__->_M_elems[0x1a] = '\0';
  __return_storage_ptr__->_M_elems[0x1b] = '\0';
  __return_storage_ptr__->_M_elems[0x1c] = '\0';
  __return_storage_ptr__->_M_elems[0x1d] = '\0';
  __return_storage_ptr__->_M_elems[0x1e] = '\0';
  __return_storage_ptr__->_M_elems[0x1f] = '\0';
  __return_storage_ptr__->_M_elems[0] = '\0';
  __return_storage_ptr__->_M_elems[1] = '\0';
  __return_storage_ptr__->_M_elems[2] = '\0';
  __return_storage_ptr__->_M_elems[3] = '\0';
  __return_storage_ptr__->_M_elems[4] = '\0';
  __return_storage_ptr__->_M_elems[5] = '\0';
  __return_storage_ptr__->_M_elems[6] = '\0';
  __return_storage_ptr__->_M_elems[7] = '\0';
  __return_storage_ptr__->_M_elems[8] = '\0';
  __return_storage_ptr__->_M_elems[9] = '\0';
  __return_storage_ptr__->_M_elems[10] = '\0';
  __return_storage_ptr__->_M_elems[0xb] = '\0';
  __return_storage_ptr__->_M_elems[0xc] = '\0';
  __return_storage_ptr__->_M_elems[0xd] = '\0';
  __return_storage_ptr__->_M_elems[0xe] = '\0';
  __return_storage_ptr__->_M_elems[0xf] = '\0';
  iVar1 = 1;
  if (ABS(val) != INFINITY) {
    dVar2 = ABS(val);
    if (ABS(val) <= tolerance) {
      dVar2 = tolerance;
    }
    dVar2 = log10(dVar2 / tolerance);
    iVar1 = (int)(dVar2 + (1.0 - tolerance));
  }
  switch(iVar1) {
  case 0:
    __return_storage_ptr__->_M_elems[0] = '0';
    __return_storage_ptr__->_M_elems[1] = '\0';
    return __return_storage_ptr__;
  case 1:
    __format = "%.1g";
    break;
  case 2:
    __format = "%.2g";
    break;
  case 3:
    __format = "%.3g";
    break;
  case 4:
    __format = "%.4g";
    break;
  case 5:
    __format = "%.5g";
    break;
  case 6:
    __format = "%.6g";
    break;
  case 7:
    __format = "%.7g";
    break;
  case 8:
    __format = "%.8g";
    break;
  case 9:
    __format = "%.9g";
    break;
  case 10:
    __format = "%.10g";
    break;
  case 0xb:
    __format = "%.11g";
    break;
  case 0xc:
    __format = "%.12g";
    break;
  case 0xd:
    __format = "%.13g";
    break;
  case 0xe:
    __format = "%.14g";
    break;
  case 0xf:
    __format = "%.15g";
    break;
  default:
    __format = "%.16g";
  }
  snprintf(__return_storage_ptr__->_M_elems,0x20,__format,val);
  return __return_storage_ptr__;
}

Assistant:

std::array<char, 32> highsDoubleToString(const double val,
                                         const double tolerance) {
  decltype(highsDoubleToString(std::declval<double>(),
                               std::declval<double>())) printString = {};
  double l =
      std::abs(val) == kHighsInf
          ? 1.0
          : (1.0 - tolerance +
             std::log10(std::max(tolerance, std::abs(val)) / (tolerance)));
  switch (int(l)) {
    case 0:
      std::snprintf(printString.data(), printString.size(), "%c", '0');
      break;
    case 1:
      std::snprintf(printString.data(), printString.size(), "%.1g", val);
      break;
    case 2:
      std::snprintf(printString.data(), printString.size(), "%.2g", val);
      break;
    case 3:
      std::snprintf(printString.data(), printString.size(), "%.3g", val);
      break;
    case 4:
      std::snprintf(printString.data(), printString.size(), "%.4g", val);
      break;
    case 5:
      std::snprintf(printString.data(), printString.size(), "%.5g", val);
      break;
    case 6:
      std::snprintf(printString.data(), printString.size(), "%.6g", val);
      break;
    case 7:
      std::snprintf(printString.data(), printString.size(), "%.7g", val);
      break;
    case 8:
      std::snprintf(printString.data(), printString.size(), "%.8g", val);
      break;
    case 9:
      std::snprintf(printString.data(), printString.size(), "%.9g", val);
      break;
    case 10:
      std::snprintf(printString.data(), printString.size(), "%.10g", val);
      break;
    case 11:
      std::snprintf(printString.data(), printString.size(), "%.11g", val);
      break;
    case 12:
      std::snprintf(printString.data(), printString.size(), "%.12g", val);
      break;
    case 13:
      std::snprintf(printString.data(), printString.size(), "%.13g", val);
      break;
    case 14:
      std::snprintf(printString.data(), printString.size(), "%.14g", val);
      break;
    case 15:
      std::snprintf(printString.data(), printString.size(), "%.15g", val);
      break;
    default:
      std::snprintf(printString.data(), printString.size(), "%.16g", val);
  }

  return printString;
}